

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ArrayJoinPromiseNode<void>::~ArrayJoinPromiseNode(ArrayJoinPromiseNode<void> *this)

{
  ExceptionOr<kj::_::Void> *pEVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pEVar1 = (this->resultParts).ptr;
  if (pEVar1 != (ExceptionOr<kj::_::Void> *)0x0) {
    sVar2 = (this->resultParts).size_;
    (this->resultParts).ptr = (ExceptionOr<kj::_::Void> *)0x0;
    (this->resultParts).size_ = 0;
    pAVar3 = (this->resultParts).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar1,0x168,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::ExceptionOr<kj::_::Void>,_false>::destruct);
  }
  ArrayJoinPromiseNodeBase::~ArrayJoinPromiseNodeBase(&this->super_ArrayJoinPromiseNodeBase);
  return;
}

Assistant:

ArrayJoinPromiseNode<void>::~ArrayJoinPromiseNode() {}